

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

int fprint<unsigned_long&,unsigned_long>
              (FILE *out,char *fmt,unsigned_long *args,unsigned_long *args_1)

{
  size_t sVar1;
  string str;
  string local_30;
  
  stringformat<unsigned_long&,unsigned_long>(&local_30,fmt,args,args_1);
  sVar1 = fwrite(local_30._M_dataplus._M_p,local_30._M_string_length,1,(FILE *)out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (int)sVar1;
}

Assistant:

int fprint(FILE *out, const char *fmt, ARGS&&...args)
{
    auto str = stringformat(fmt, std::forward<ARGS>(args)...);
    return fwrite(str.c_str(), str.size(), 1, out);
}